

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O1

_Bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream,void *val)

{
  ALLEGRO_MUTEX *pAVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _Bool _Var6;
  
  pAVar1 = (stream->spl).mutex;
  if (pAVar1 != (ALLEGRO_MUTEX *)0x0) {
    al_lock_mutex();
  }
  uVar3 = (ulong)stream->buf_count;
  _Var6 = uVar3 != 0;
  if (_Var6) {
    if (*stream->pending_bufs == (void *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if (uVar3 - 1 == uVar5) {
          _Var6 = false;
          goto LAB_0010ca5f;
        }
        uVar4 = uVar5 + 1;
        lVar2 = uVar5 + 1;
        uVar5 = uVar4;
      } while (stream->pending_bufs[lVar2] != (void *)0x0);
      _Var6 = uVar4 < uVar3;
    }
    if (_Var6 != false) {
      stream->pending_bufs[uVar4] = val;
      goto LAB_0010ca70;
    }
  }
LAB_0010ca5f:
  _al_set_error(2,"Attempted to set a stream buffer with a full pending list");
LAB_0010ca70:
  if (pAVar1 != (ALLEGRO_MUTEX *)0x0) {
    al_unlock_mutex(pAVar1);
  }
  return _Var6;
}

Assistant:

bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream, void *val)
{
   size_t i;
   bool ret;
   ALLEGRO_MUTEX *stream_mutex;
   ASSERT(stream);

   stream_mutex = maybe_lock_mutex(stream->spl.mutex);

   for (i = 0; i < stream->buf_count && stream->pending_bufs[i] ; i++)
      ;
   if (i < stream->buf_count) {
      stream->pending_bufs[i] = val;
      ret = true;
   }
   else {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to set a stream buffer with a full pending list");
      ret = false;
   }

   maybe_unlock_mutex(stream_mutex);

   return ret;
}